

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O1

Token __thiscall slang::parsing::Preprocessor::MacroParser::expect(MacroParser *this,TokenKind kind)

{
  undefined2 uVar1;
  undefined1 uVar5;
  undefined1 uVar6;
  pointer pTVar2;
  pointer pTVar3;
  BumpAllocator *alloc;
  Diagnostics *diagnostics;
  undefined4 uVar7;
  Info *pIVar4;
  Token matchingDelim;
  ulong uVar8;
  Token TVar9;
  Token actual;
  Token last;
  Token local_68;
  Token local_58;
  Token local_40;
  
  uVar8 = (ulong)this->currentIndex;
  if ((this->buffer)._M_extent._M_extent_value <= uVar8) {
    TVar9 = Preprocessor::expect(this->pp,kind);
    return TVar9;
  }
  pTVar2 = (this->buffer)._M_ptr;
  if (pTVar2[uVar8].kind == kind) {
    TVar9 = next(this);
    return TVar9;
  }
  if (uVar8 == 0) {
    Token::Token(&local_68);
  }
  else {
    pTVar2 = pTVar2 + (this->currentIndex - 1);
    local_68.kind = pTVar2->kind;
    local_68._2_1_ = pTVar2->field_0x2;
    local_68.numFlags.raw = (pTVar2->numFlags).raw;
    local_68.rawLen = pTVar2->rawLen;
    local_68.info = pTVar2->info;
  }
  pTVar3 = (this->buffer)._M_ptr;
  alloc = this->pp->alloc;
  diagnostics = this->pp->diagnostics;
  pTVar2 = pTVar3 + this->currentIndex;
  uVar1 = pTVar2->kind;
  uVar5 = pTVar2->field_0x2;
  uVar6 = pTVar2->numFlags;
  uVar7 = pTVar2->rawLen;
  actual.rawLen = uVar7;
  actual.numFlags.raw = uVar6;
  actual._2_1_ = uVar5;
  actual.kind = uVar1;
  pIVar4 = pTVar3[this->currentIndex].info;
  local_58.kind = local_68.kind;
  local_58._2_1_ = local_68._2_1_;
  local_58.numFlags.raw = local_68.numFlags.raw;
  local_58.rawLen = local_68.rawLen;
  local_58.info = local_68.info;
  Token::Token(&local_40);
  TVar9.info = local_58.info;
  TVar9.kind = local_58.kind;
  TVar9._2_1_ = local_58._2_1_;
  TVar9.numFlags.raw = local_58.numFlags.raw;
  TVar9.rawLen = local_58.rawLen;
  matchingDelim.info = local_40.info;
  matchingDelim.kind = local_40.kind;
  matchingDelim._2_1_ = local_40._2_1_;
  matchingDelim.numFlags.raw = local_40.numFlags.raw;
  matchingDelim.rawLen = local_40.rawLen;
  actual.info = pIVar4;
  TVar9 = Token::createExpected(alloc,diagnostics,actual,kind,TVar9,matchingDelim);
  return TVar9;
}

Assistant:

Token Preprocessor::MacroParser::expect(TokenKind kind) {
    if (currentIndex >= buffer.size())
        return pp.expect(kind);

    if (buffer[currentIndex].kind != kind) {
        Token last = currentIndex > 0 ? buffer[currentIndex - 1] : Token();
        return Token::createExpected(pp.alloc, pp.diagnostics, buffer[currentIndex], kind, last,
                                     Token());
    }
    return next();
}